

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void encode_b(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
             int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
             PICK_MODE_CONTEXT *ctx,int *rate)

{
  uint16_t *puVar1;
  CANDIDATE_MV *pCVar2;
  uint8_t *puVar3;
  BLOCK_SIZE BVar4;
  uint8_t uVar5;
  _Bool _Var6;
  MOTION_MODE MVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  SequenceHeader *pSVar11;
  MB_MODE_INFO *pMVar12;
  MB_MODE_INFO_EXT_FRAME *pMVar13;
  MB_MODE_INFO *pMVar14;
  bool bVar15;
  CANDIDATE_MV CVar16;
  CANDIDATE_MV CVar17;
  CANDIDATE_MV CVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  ushort uVar22;
  scale_factors *psVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  undefined4 uVar31;
  int *piVar30;
  
  pSVar11 = (cpi->common).seq_params;
  iVar8 = pSVar11->subsampling_x;
  iVar9 = pSVar11->subsampling_y;
  uVar29 = (ulong)bsize;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  iVar10 = (td->mb).rdmult;
  uVar31 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  pMVar12 = *(td->mb).e_mbd.mi;
  pMVar12->partition = partition;
  piVar30 = (int *)CONCAT44(uVar31,(uint)dry_run);
  av1_update_state(cpi,td,ctx,mi_row,mi_col,bsize,dry_run);
  if (dry_run != 0) {
    encode_superblock(cpi,tile_data,td,tp,'\x01',bsize,piVar30);
    goto LAB_001e9fe3;
  }
  *(undefined4 *)((td->mb).mbmi_ext_frame)->cb_offset = *(undefined4 *)(td->mb).cb_offset;
  encode_superblock(cpi,tile_data,td,tp,'\0',bsize,piVar30);
  puVar1 = (td->mb).cb_offset;
  *puVar1 = *puVar1 + (ushort)block_size_high[uVar29] * (ushort)block_size_wide[uVar29];
  if ((td->mb).e_mbd.is_chroma_ref == true) {
    BVar4 = av1_ss_size_lookup[uVar29][iVar8][iVar9];
    puVar1 = (td->mb).cb_offset + 1;
    *puVar1 = *puVar1 + (ushort)block_size_high[BVar4] * (ushort)block_size_wide[BVar4];
  }
  pSVar11 = (cpi->common).seq_params;
  if (((pSVar11->sb_size == bsize) && (pMVar12->skip_txfm == '\x01')) &&
     ((cpi->common).delta_q_info.delta_lf_present_flag != 0)) {
    uVar5 = pSVar11->monochrome;
    lVar28 = 0;
    do {
      pMVar12->delta_lf[lVar28] = (td->mb).e_mbd.delta_lf[lVar28];
      lVar28 = lVar28 + 1;
    } while ((ulong)(uVar5 == '\0') * 2 + 2 != lVar28);
    pMVar12->delta_lf_from_base = (td->mb).e_mbd.delta_lf_from_base;
  }
  if ('\0' < pMVar12->ref_frame[1]) {
    uVar22 = *(ushort *)&pMVar12->field_0xa7;
    if (((uVar22 >> 9 & 1) == 0) || ((pMVar12->interinter_comp).type == '\0')) {
      uVar22 = uVar22 & 0xfeff;
    }
    else {
      uVar22 = uVar22 | 0x100;
    }
    *(ushort *)&pMVar12->field_0xa7 = uVar22;
  }
  if ((cpi->common).delta_q_info.delta_q_present_flag != 0) {
    pSVar11 = (cpi->common).seq_params;
    uVar27 = (mi_col | mi_row) & pSVar11->mib_size - 1U;
    if (pSVar11->sb_size == bsize) {
      if ((uVar27 == 0) && (pMVar12->skip_txfm == '\0')) {
LAB_001ea230:
        (td->mb).e_mbd.current_base_qindex = pMVar12->current_qindex;
        if ((cpi->common).delta_q_info.delta_lf_present_flag != 0) {
          if ((cpi->common).delta_q_info.delta_lf_multi == 0) {
            (td->mb).e_mbd.delta_lf_from_base = pMVar12->delta_lf_from_base;
          }
          else {
            uVar5 = pSVar11->monochrome;
            lVar28 = 0;
            do {
              (td->mb).e_mbd.delta_lf[lVar28] = pMVar12->delta_lf[lVar28];
              lVar28 = lVar28 + 1;
            } while ((ulong)(uVar5 == '\0') * 2 + 2 != lVar28);
          }
        }
      }
    }
    else if (uVar27 == 0) goto LAB_001ea230;
  }
  uVar22 = *(ushort *)&pMVar12->field_0xa7;
  if ((uVar22 & 0x40) == 0) {
    if ((((cpi->common).seg.enabled == '\0') ||
        (((cpi->common).seg.feature_mask[uVar22 & 7] & 0x20) == 0)) &&
       (((char)uVar22 < '\0' || ('\0' < pMVar12->ref_frame[0])))) {
      (td->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      _Var6 = (td->mb).e_mbd.left_available;
      if ((td->mb).e_mbd.up_available == true) {
        pMVar14 = (td->mb).e_mbd.above_mbmi;
        if ((pMVar14->field_0xa7 & 0x80) != 0 || '\0' < pMVar14->ref_frame[0]) {
          puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar14->ref_frame[0];
          *puVar3 = *puVar3 + '\x01';
          if (0 < (long)pMVar14->ref_frame[1]) {
            puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar14->ref_frame[1];
            *puVar3 = *puVar3 + '\x01';
          }
        }
      }
      if (_Var6 != false) {
        pMVar14 = (td->mb).e_mbd.left_mbmi;
        if ((pMVar14->field_0xa7 & 0x80) != 0 || '\0' < pMVar14->ref_frame[0]) {
          puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar14->ref_frame[0];
          *puVar3 = *puVar3 + '\x01';
          if (0 < (long)pMVar14->ref_frame[1]) {
            puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar14->ref_frame[1];
            *puVar3 = *puVar3 + '\x01';
          }
        }
      }
      if ((cpi->common).current_frame.reference_mode == '\x02') {
        bVar25 = pMVar12->ref_frame[1];
        if ('\0' < (char)bVar25) {
          (td->rd_counts).compound_ref_used_flag = 1;
          goto LAB_001ea384;
        }
      }
      else {
LAB_001ea384:
        bVar25 = pMVar12->ref_frame[1];
      }
      bVar24 = pMVar12->ref_frame[0];
      goto LAB_001ea3bf;
    }
  }
  else {
    (td->rd_counts).skip_mode_used_flag = 1;
    if ((cpi->common).current_frame.reference_mode == '\x02') {
      (td->rd_counts).compound_ref_used_flag = 1;
    }
    bVar24 = pMVar12->ref_frame[0];
    bVar25 = pMVar12->ref_frame[1];
LAB_001ea3bf:
    if ((char)bVar24 < '\t') {
      bVar26 = 1;
      if ('\x01' < (char)bVar24) {
        bVar26 = bVar24;
      }
      iVar8 = (cpi->common).remapped_ref_idx[bVar26 - 1];
      if (iVar8 == -1) goto LAB_001ea3f7;
      psVar23 = (cpi->common).ref_scale_factors + iVar8;
    }
    else {
LAB_001ea3f7:
      psVar23 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar23;
    if ((char)bVar25 < '\t') {
      bVar24 = 1;
      if ('\x01' < (char)bVar25) {
        bVar24 = bVar25;
      }
      iVar8 = (cpi->common).remapped_ref_idx[bVar24 - 1];
      if (iVar8 == -1) goto LAB_001ea436;
      psVar23 = (cpi->common).ref_scale_factors + iVar8;
    }
    else {
LAB_001ea436:
      psVar23 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar23;
  }
  if (tile_data->allow_update_cdf != '\0') {
    update_stats(&cpi->common,td);
  }
  if (((cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U < 0x80000002) &&
     (((cpi->common).features.allow_warped_motion != true ||
      ((cpi->sf).inter_sf.prune_warped_prob_thresh < 1)))) goto LAB_001e9fe3;
  bVar15 = true;
  if (-1 < (char)*(ushort *)&pMVar12->field_0xa7) {
    bVar15 = '\0' < pMVar12->ref_frame[0];
  }
  if ((cpi->common).seg.enabled != '\0') {
    bVar15 = (bool)(((cpi->common).seg.feature_mask[*(ushort *)&pMVar12->field_0xa7 & 7] & 0x20) ==
                    0 & bVar15);
  }
  if (((!bVar15) || ((cpi->common).features.switchable_motion_mode != true)) ||
     (pMVar12->overlappable_neighbors == '\0')) goto LAB_001e9fe3;
  iVar8 = (td->mb).e_mbd.cur_frame_force_integer_mv;
  BVar4 = pMVar12->bsize;
  if (iVar8 == 0) {
    bVar25 = block_size_high[BVar4];
    if (block_size_wide[BVar4] < block_size_high[BVar4]) {
      bVar25 = block_size_wide[BVar4];
    }
    if (((1 < (td->mb).e_mbd.global_motion[pMVar12->ref_frame[0]].wmtype) &&
        ((pMVar12->mode - 0xf & 0xf7) == 0)) && (7 < bVar25)) goto LAB_001e9fe3;
  }
  else {
    bVar25 = block_size_high[BVar4];
    if (block_size_wide[BVar4] < block_size_high[BVar4]) {
      bVar25 = block_size_wide[BVar4];
    }
  }
  if (((bVar25 < 8) || ((byte)(pMVar12->mode - 0x19) < 0xf4)) || (-1 < pMVar12->ref_frame[1]))
  goto LAB_001e9fe3;
  if (((iVar8 == 0) && ((cpi->common).features.allow_warped_motion != false)) &&
     (pMVar12->num_proj_ref != '\0')) {
    psVar23 = (td->mb).e_mbd.block_ref_scale_factors[0];
    iVar8 = psVar23->x_scale_fp;
    bVar15 = true;
    if (((iVar8 != -1) && (iVar9 = psVar23->y_scale_fp, iVar9 != -1)) &&
       (iVar9 != 0x4000 || iVar8 != 0x4000)) goto switchD_001e818a_caseD_43;
  }
  else {
switchD_001e818a_caseD_43:
    bVar15 = false;
  }
  MVar7 = pMVar12->motion_mode;
  piVar30 = (td->rd_counts).obmc_used[uVar29] + (MVar7 == '\x01');
  *piVar30 = *piVar30 + 1;
  if (bVar15) {
    piVar30 = (td->rd_counts).warped_used + (MVar7 == '\x02');
    *piVar30 = *piVar30 + 1;
  }
LAB_001e9fe3:
  pMVar13 = (td->mb).mbmi_ext_frame;
  pMVar12 = *(td->mb).e_mbd.mi;
  bVar25 = pMVar12->ref_frame[0];
  bVar24 = pMVar12->ref_frame[1];
  if ('\0' < (char)bVar24) {
    if (bVar24 < 5 || '\x04' < (char)bVar25) {
      lVar28 = 0;
      do {
        if ((bVar25 == (&comp_ref0_lut)[lVar28]) && (bVar24 == (&comp_ref1_lut)[lVar28])) {
          bVar25 = (char)lVar28 + 0x14;
          goto LAB_001ea043;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 9);
    }
    bVar25 = (bVar24 * '\x04' + bVar25) - 0xd;
  }
LAB_001ea043:
  pCVar2 = (td->mb).mbmi_ext.ref_mv_stack[bVar25];
  CVar16 = *pCVar2;
  CVar17 = pCVar2[1];
  pCVar2 = (td->mb).mbmi_ext.ref_mv_stack[bVar25] + 2;
  CVar18 = pCVar2[1];
  pMVar13->ref_mv_stack[2] = *pCVar2;
  pMVar13->ref_mv_stack[3] = CVar18;
  pMVar13->ref_mv_stack[0] = CVar16;
  pMVar13->ref_mv_stack[1] = CVar17;
  *&pMVar13->weight = (td->mb).mbmi_ext.weight[bVar25];
  pMVar13->mode_context = (td->mb).mbmi_ext.mode_context[bVar25];
  pMVar13->ref_mv_count = (td->mb).mbmi_ext.ref_mv_count[bVar25];
  uVar19 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2);
  uVar20 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4);
  uVar21 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6);
  *(undefined8 *)pMVar13->global_mvs = *(undefined8 *)(td->mb).mbmi_ext.global_mvs;
  *(undefined8 *)(pMVar13->global_mvs + 2) = uVar19;
  *(undefined8 *)(pMVar13->global_mvs + 4) = uVar20;
  *(undefined8 *)(pMVar13->global_mvs + 6) = uVar21;
  (td->mb).rdmult = iVar10;
  return;
}

Assistant:

static void encode_b(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                     ThreadData *td, TokenExtra **tp, int mi_row, int mi_col,
                     RUN_TYPE dry_run, BLOCK_SIZE bsize,
                     PARTITION_TYPE partition, PICK_MODE_CONTEXT *const ctx,
                     int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const int subsampling_x = cm->seq_params->subsampling_x;
  const int subsampling_y = cm->seq_params->subsampling_y;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);

  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);

  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (bsize == cpi->common.seq_params->sb_size && mbmi->skip_txfm == 1 &&
        cm->delta_q_info.delta_lf_present_flag) {
      const int frame_lf_count =
          av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
      for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id)
        mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id];
      mbmi->delta_lf_from_base = xd->delta_lf_from_base;
    }
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
    }

    // delta quant applies to both intra and inter
    const int super_block_upper_left =
        ((mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((mi_col & (cm->seq_params->mib_size - 1)) == 0);
    const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
    if (delta_q_info->delta_q_present_flag &&
        (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
        super_block_upper_left) {
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }

    RD_COUNTS *rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
        assert(has_second_ref(mbmi));
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
            if (has_second_ref(mbmi)) {
              // This flag is also updated for 4x4 blocks
              rdc->compound_ref_used_flag = 1;
            }
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }

    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);

    // Gather obmc and warped motion count to update the probability.
    if ((cpi->sf.inter_sf.prune_obmc_prob_thresh > 0 &&
         cpi->sf.inter_sf.prune_obmc_prob_thresh < INT_MAX) ||
        (cm->features.allow_warped_motion &&
         cpi->sf.inter_sf.prune_warped_prob_thresh > 0)) {
      const int inter_block = is_inter_block(mbmi);
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active && inter_block) {
        const MOTION_MODE motion_allowed =
            cm->features.switchable_motion_mode
                ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                      cm->features.allow_warped_motion)
                : SIMPLE_TRANSLATION;

        if (mbmi->ref_frame[1] != INTRA_FRAME) {
          if (motion_allowed >= OBMC_CAUSAL) {
            td->rd_counts.obmc_used[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
          }
          if (motion_allowed == WARPED_CAUSAL) {
            td->rd_counts.warped_used[mbmi->motion_mode == WARPED_CAUSAL]++;
          }
        }
      }
    }
  }
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
}